

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  double dVar2;
  initializer_list<double> __l;
  _Any_data local_68 [2];
  function<double_(double,_double)> func;
  vector<double,_std::allocator<double>_> test;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Test fold...");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_68[0]._M_unused._M_member_pointer = 0x3ff0000000000000;
  local_68[0]._8_8_ = 0x3ff3333333333333;
  __l._M_len = 2;
  __l._M_array = (iterator)local_68;
  std::vector<double,_std::allocator<double>_>::vector(&test,__l,(allocator_type *)&func);
  func.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  func.super__Function_base._M_functor._8_8_ = 0;
  func._M_invoker =
       std::
       _Function_handler<double_(double,_double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/foldLeft/main.cpp:15:44)>
       ::_M_invoke;
  func.super__Function_base._M_manager =
       std::
       _Function_handler<double_(double,_double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/foldLeft/main.cpp:15:44)>
       ::_M_manager;
  std::function<double_(double,_double)>::function
            ((function<double_(double,_double)> *)local_68,&func);
  dVar2 = std::
          accumulate<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double,std::function<double(double,double)>>
                    ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      )test.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
                     (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      )test.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,0.0,
                     (function<double_(double,_double)> *)local_68);
  std::_Function_base::~_Function_base((_Function_base *)local_68);
  if ((dVar2 == 2.2) && (!NAN(dVar2))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"passed!");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::_Function_base::~_Function_base(&func.super__Function_base);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&test.super__Vector_base<double,_std::allocator<double>_>);
    return 0;
  }
  __assert_fail("expectedFold==folded",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/foldLeft/main.cpp"
                ,0x11,"int main()");
}

Assistant:

int main(){
    
  cout << "Test fold..." << endl;
  vector<double> test={1.0, 1.2};     
  double expectedFold = 2.2;
  function< double(double,double)  > func= [](double  a, double  b){return a+b;};
  auto folded = Functional::foldLeft(test, func);  
  assert(expectedFold==folded);
  cout << "passed!" << endl;
  return 0;

}